

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void chan_updaterhythm(opl_chip *chip,Bit8u data)

{
  opl_channel *channel;
  opl_channel *poVar1;
  opl_channel *poVar2;
  byte local_32;
  byte local_31;
  Bit8u chnum_1;
  Bit8u chnum;
  opl_channel *channel8;
  opl_channel *channel7;
  opl_channel *channel6;
  Bit8u data_local;
  opl_chip *chip_local;
  
  chip->rhy = data & 0x3f;
  if ((chip->rhy & 0x20) == 0) {
    for (local_32 = 6; local_32 < 9; local_32 = local_32 + 1) {
      chip->channel[local_32].chtype = '\0';
      chan_setupalg(chip->channel + local_32);
    }
  }
  else {
    channel = chip->channel + 6;
    poVar1 = chip->channel + 7;
    poVar2 = chip->channel + 8;
    chip->channel[6].out[0] = &chip->channel[6].slots[1]->out;
    chip->channel[6].out[1] = &chip->channel[6].slots[1]->out;
    chip->channel[6].out[2] = &chip->zeromod;
    chip->channel[6].out[3] = &chip->zeromod;
    chip->channel[7].out[0] = &poVar1->slots[0]->out;
    chip->channel[7].out[1] = &poVar1->slots[0]->out;
    chip->channel[7].out[2] = &chip->channel[7].slots[1]->out;
    chip->channel[7].out[3] = &chip->channel[7].slots[1]->out;
    chip->channel[8].out[0] = &poVar2->slots[0]->out;
    chip->channel[8].out[1] = &poVar2->slots[0]->out;
    chip->channel[8].out[2] = &chip->channel[8].slots[1]->out;
    chip->channel[8].out[3] = &chip->channel[8].slots[1]->out;
    for (local_31 = 6; local_31 < 9; local_31 = local_31 + 1) {
      chip->channel[local_31].chtype = '\x03';
    }
    chan_setupalg(channel);
    if ((chip->rhy & 1) == 0) {
      eg_keyoff(poVar1->slots[0],'\x02');
    }
    else {
      eg_keyon(poVar1->slots[0],'\x02');
    }
    if ((chip->rhy & 2) == 0) {
      eg_keyoff(chip->channel[8].slots[1],'\x02');
    }
    else {
      eg_keyon(chip->channel[8].slots[1],'\x02');
    }
    if ((chip->rhy & 4) == 0) {
      eg_keyoff(poVar2->slots[0],'\x02');
    }
    else {
      eg_keyon(poVar2->slots[0],'\x02');
    }
    if ((chip->rhy & 8) == 0) {
      eg_keyoff(chip->channel[7].slots[1],'\x02');
    }
    else {
      eg_keyon(chip->channel[7].slots[1],'\x02');
    }
    if ((chip->rhy & 0x10) == 0) {
      eg_keyoff(channel->slots[0],'\x02');
      eg_keyoff(chip->channel[6].slots[1],'\x02');
    }
    else {
      eg_keyon(channel->slots[0],'\x02');
      eg_keyon(chip->channel[6].slots[1],'\x02');
    }
  }
  return;
}

Assistant:

void chan_updaterhythm(opl_chip *chip, Bit8u data) {
	chip->rhy = data & 0x3f;
	if (chip->rhy & 0x20) {
		opl_channel *channel6 = &chip->channel[6];
		opl_channel *channel7 = &chip->channel[7];
		opl_channel *channel8 = &chip->channel[8];
		channel6->out[0] = &channel6->slots[1]->out;
		channel6->out[1] = &channel6->slots[1]->out;
		channel6->out[2] = &chip->zeromod;
		channel6->out[3] = &chip->zeromod;
		channel7->out[0] = &channel7->slots[0]->out;
		channel7->out[1] = &channel7->slots[0]->out;
		channel7->out[2] = &channel7->slots[1]->out;
		channel7->out[3] = &channel7->slots[1]->out;
		channel8->out[0] = &channel8->slots[0]->out;
		channel8->out[1] = &channel8->slots[0]->out;
		channel8->out[2] = &channel8->slots[1]->out;
		channel8->out[3] = &channel8->slots[1]->out;
		for (Bit8u chnum = 6; chnum < 9; chnum++) {
			chip->channel[chnum].chtype = ch_drum;
		}
		chan_setupalg(channel6);
		//hh
		if (chip->rhy & 0x01) {
			eg_keyon(channel7->slots[0], egk_drum);
		}
		else {
			eg_keyoff(channel7->slots[0], egk_drum);
		}
		//tc
		if (chip->rhy & 0x02) {
			eg_keyon(channel8->slots[1], egk_drum);
		}
		else {
			eg_keyoff(channel8->slots[1], egk_drum);
		}
		//tom
		if (chip->rhy & 0x04) {
			eg_keyon(channel8->slots[0], egk_drum);
		}
		else {
			eg_keyoff(channel8->slots[0], egk_drum);
		}
		//sd
		if (chip->rhy & 0x08) {
			eg_keyon(channel7->slots[1], egk_drum);
		}
		else {
			eg_keyoff(channel7->slots[1], egk_drum);
		}
		//bd
		if (chip->rhy & 0x10) {
			eg_keyon(channel6->slots[0], egk_drum);
			eg_keyon(channel6->slots[1], egk_drum);
		}
		else {
			eg_keyoff(channel6->slots[0], egk_drum);
			eg_keyoff(channel6->slots[1], egk_drum);
		}
	}
	else {
		for (Bit8u chnum = 6; chnum < 9; chnum++) {
			chip->channel[chnum].chtype = ch_2op;
			chan_setupalg(&chip->channel[chnum]);
		}
	}
}